

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::verifyIntegerAnyOf
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLint *references,
          size_t referencesLength)

{
  bool bVar1;
  qpTestResult qVar2;
  long *plVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1d8;
  long local_58;
  GLint64 expectedGLState;
  size_t ndx;
  StateQueryMemoryWriteGuard<long> state;
  size_t referencesLength_local;
  GLint *references_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  state.m_postguard = referencesLength;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long> *)&ndx);
  plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::operator&
                     ((StateQueryMemoryWriteGuard<long> *)&ndx);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,plVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long> *)&ndx,testCtx);
  if (bVar1) {
    for (expectedGLState = 0; (ulong)expectedGLState < (ulong)state.m_postguard;
        expectedGLState = expectedGLState + 1) {
      local_58 = (long)references[expectedGLState];
      plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                         ((StateQueryMemoryWriteGuard *)&ndx);
      if (*plVar3 == local_58) {
        return;
      }
    }
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [15])"// ERROR: got ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<long> *)&ndx);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyIntegerAnyOf (tcu::TestContext& testCtx, GLenum name, const GLint references[], size_t referencesLength)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	for (size_t ndx = 0; ndx < referencesLength; ++ndx)
	{
		const GLint64 expectedGLState = GLint64(references[ndx]);

		if (state == expectedGLState)
			return;
	}

	testCtx.getLog() << TestLog::Message << "// ERROR: got " << state << TestLog::EndMessage;
	if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
}